

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Gia_ObjEvalEdgeDelay(Gia_Man_t *p,int iObj,Vec_Int_t *vDelay)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  
  if ((p->vMapping != (Vec_Int_t *)0x0) && (iVar1 = Gia_ObjIsLut(p,iObj), iVar1 != 0)) {
    iVar1 = Gia_ObjLutSize(p,iObj);
    if (iVar1 < 5) {
      iVar1 = 0;
      for (lVar6 = 0; iVar2 = Gia_ObjLutSize(p,iObj), lVar6 < iVar2; lVar6 = lVar6 + 1) {
        piVar5 = Gia_ObjLutFanins(p,iObj);
        iVar2 = piVar5[lVar6];
        iVar3 = Vec_IntEntry(vDelay,iVar2);
        iVar2 = Gia_ObjHaveEdge(p,iObj,iVar2);
        iVar2 = iVar3 + 2 + (uint)(iVar2 == 0) * 8;
        if (iVar1 <= iVar2) {
          iVar1 = iVar2;
        }
      }
      return iVar1;
    }
    __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0xb6,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
  }
  iVar1 = Gia_ObjIsLut2(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0xc6,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
  }
  iVar1 = Gia_ObjLutSize2(p,iObj);
  if (iVar1 < 5) {
    iVar1 = 0;
    for (iVar2 = 0; iVar3 = Gia_ObjLutSize2(p,iObj), iVar2 < iVar3; iVar2 = iVar2 + 1) {
      iVar3 = Gia_ObjLutFanin2(p,iObj,iVar2);
      iVar4 = Vec_IntEntry(vDelay,iVar3);
      iVar3 = Gia_ObjHaveEdge(p,iObj,iVar3);
      iVar3 = iVar4 + (uint)(iVar3 == 0) * 8 + 2;
      if (iVar1 <= iVar3) {
        iVar1 = iVar3;
      }
    }
    return iVar1;
  }
  __assert_fail("Gia_ObjLutSize2(p, iObj) <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0xbf,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
}

Assistant:

static inline int Gia_ObjEvalEdgeDelay( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay )
{
    int nEdgeDelay = 2;
    int i, iFan, Delay, DelayMax = 0;
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry(vDelay, iFan) + (Gia_ObjHaveEdge(p, iObj, iFan) ? nEdgeDelay : 10);
            DelayMax = Abc_MaxInt( DelayMax, Delay );
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        assert( Gia_ObjLutSize2(p, iObj) <= 4 );
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry(vDelay, iFan) + (Gia_ObjHaveEdge(p, iObj, iFan) ? nEdgeDelay : 10);
            DelayMax = Abc_MaxInt( DelayMax, Delay );
        }
    }
    else assert( 0 );
    return DelayMax;
}